

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateFastIsInst(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  Opnd *opnd;
  Opnd *opnd_00;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  LabelInstr *target;
  LabelInstr *labelTarget;
  RegOpnd *baseOpnd;
  JITTimeFunctionBody *this_00;
  IntConstOpnd *pIVar5;
  intptr_t iVar6;
  RegOpnd *pRVar7;
  undefined4 *puVar8;
  Opnd *src;
  MemRefOpnd *pMVar9;
  IndirOpnd *pIVar10;
  Lowerer *pLVar11;
  
  target = IR::LabelInstr::New(Label,this->m_func,true);
  labelTarget = IR::LabelInstr::New(Label,this->m_func,false);
  baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  this_00 = Func::GetJITFunctionBody(instr->m_func);
  pIVar5 = IR::Opnd::AsIntConstOpnd(instr->m_src1);
  uVar4 = IR::IntConstOpnd::AsUint32(pIVar5);
  iVar6 = JITTimeFunctionBody::GetIsInstInlineCache(this_00,uVar4);
  pRVar7 = IR::Opnd::AsRegOpnd(instr->m_src2);
  if ((pRVar7->m_sym->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5b57,"(instr->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef)",
                       "instr->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef");
    if (!bVar3) goto LAB_00552284;
    *puVar8 = 0;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(instr->m_src2);
  pIVar1 = (pRVar7->m_sym->field_5).m_instrDef;
  opnd = pIVar1->m_src1;
  pRVar7 = IR::Opnd::AsRegOpnd(pIVar1->m_src2);
  if ((pRVar7->m_sym->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5b5b,"(instrArg->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef)",
                       "instrArg->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef");
    if (!bVar3) goto LAB_00552284;
    *puVar8 = 0;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(pIVar1->m_src2);
  pIVar1 = (pRVar7->m_sym->field_5).m_instrDef;
  opnd_00 = pIVar1->m_src1;
  if (pIVar1->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5b5f,"(instrArg->GetSrc2() == nullptr)","instrArg->GetSrc2() == nullptr");
    if (!bVar3) {
LAB_00552284:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pLVar11 = (Lowerer *)instr->m_dst;
  src = LoadLibraryValueOpnd(this,instr,ValueFalse);
  InsertMove((Opnd *)pLVar11,src,instr,true);
  pRVar7 = GetRegOpnd(pLVar11,opnd_00,instr,this->m_func,TyInt64);
  uVar4 = Js::IsInstInlineCache::OffsetOfFunction();
  pMVar9 = IR::MemRefOpnd::New((ulong)uVar4 + iVar6,TyInt64,this->m_func,
                               AddrOpndKindDynamicIsInstInlineCacheFunctionRef);
  InsertCompare(&pRVar7->super_Opnd,&pMVar9->super_Opnd,instr);
  pLVar11 = (Lowerer *)0xd;
  InsertBranch(BrNeq_A,target,instr);
  pRVar7 = GetRegOpnd(pLVar11,opnd,instr,this->m_func,TyInt64);
  LowererMD::GenerateObjectTest(&this->m_lowererMD,&pRVar7->super_Opnd,instr,labelTarget,false);
  pIVar10 = IR::IndirOpnd::New(pRVar7,8,TyInt64,this->m_func,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar10->super_Opnd,instr,true);
  uVar4 = Js::Type::GetOffsetOfTypeId();
  pIVar10 = IR::IndirOpnd::New(baseOpnd,uVar4,TyInt32,this->m_func,false);
  pIVar5 = IR::IntConstOpnd::New(0x16,TyInt32,this->m_func,false);
  InsertCompare(&pIVar10->super_Opnd,&pIVar5->super_Opnd,instr);
  InsertBranch(BrLe_A,labelTarget,instr);
  uVar4 = Js::IsInstInlineCache::OffsetOfType();
  pMVar9 = IR::MemRefOpnd::New((ulong)uVar4 + iVar6,TyInt64,this->m_func,
                               AddrOpndKindDynamicIsInstInlineCacheTypeRef);
  InsertCompare(&baseOpnd->super_Opnd,&pMVar9->super_Opnd,instr);
  InsertBranch(BrNeq_A,target,instr);
  uVar4 = Js::IsInstInlineCache::OffsetOfResult();
  pMVar9 = IR::MemRefOpnd::New((ulong)uVar4 + iVar6,TyInt64,this->m_func,
                               AddrOpndKindDynamicIsInstInlineCacheResultRef);
  InsertMove(instr->m_dst,&pMVar9->super_Opnd,instr,true);
  InsertBranch(Br,labelTarget,instr);
  IR::Instr::InsertBefore(instr,&target->super_Instr);
  IR::Instr::InsertAfter(instr,&labelTarget->super_Instr);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastIsInst(IR::Instr * instr)
{
    IR::LabelInstr * helper = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr * done = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::RegOpnd * typeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::Opnd * objectSrc;
    IR::Opnd * functionSrc;
    intptr_t inlineCache;
    IR::Instr * instrArg;

    // We are going to use the extra ArgOut_A instructions to lower the helper call later,
    // so we leave them alone here and clean them up then.
    inlineCache = instr->m_func->GetJITFunctionBody()->GetIsInstInlineCache(instr->GetSrc1()->AsIntConstOpnd()->AsUint32());
    Assert(instr->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef);
    instrArg = instr->GetSrc2()->AsRegOpnd()->m_sym->m_instrDef;

    objectSrc = instrArg->GetSrc1();
    Assert(instrArg->GetSrc2()->AsRegOpnd()->m_sym->m_isSingleDef);
    instrArg = instrArg->GetSrc2()->AsRegOpnd()->m_sym->m_instrDef;

    functionSrc = instrArg->GetSrc1();
    Assert(instrArg->GetSrc2() == nullptr);

    // MOV dst, Js::false
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), instr);

    IR::RegOpnd * functionReg = GetRegOpnd(functionSrc, instr, m_func, TyMachReg);

    // CMP functionReg, [&(inlineCache->function)]
    {
        IR::Opnd* cacheFunction = IR::MemRefOpnd::New(inlineCache + Js::IsInstInlineCache::OffsetOfFunction(), TyMachReg, m_func, IR::AddrOpndKindDynamicIsInstInlineCacheFunctionRef);
        InsertCompare(functionReg, cacheFunction, instr);
    }

    // JNE helper
    InsertBranch(Js::OpCode::BrNeq_A, helper, instr);

    IR::RegOpnd * objectReg = GetRegOpnd(objectSrc, instr, m_func, TyMachReg);

    // TEST objectReg, Js::AtomTag
    // JNE done
    m_lowererMD.GenerateObjectTest(objectReg, instr, done);

    // MOV typeReg, objectSrc + offsetof(RecyclableObject::type)
    InsertMove(typeReg, IR::IndirOpnd::New(objectReg, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func), instr);

    // CMP [typeReg + offsetof(Type::typeid)], TypeIds_LastJavascriptPrimitiveType
    {
        IR::IndirOpnd * typeId = IR::IndirOpnd::New(typeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func);
        IR::IntConstOpnd * lastPrimitive = IR::IntConstOpnd::New(Js::TypeId::TypeIds_LastJavascriptPrimitiveType, TyInt32, m_func);
        InsertCompare(typeId, lastPrimitive, instr);
    }

    // JLE done
    InsertBranch(Js::OpCode::BrLe_A, done, instr);

    // CMP typeReg, [&(inlineCache->type]
    {
        IR::Opnd * cacheType = IR::MemRefOpnd::New(inlineCache + Js::IsInstInlineCache::OffsetOfType(), TyMachReg, m_func, IR::AddrOpndKindDynamicIsInstInlineCacheTypeRef);
        InsertCompare(typeReg, cacheType, instr);
    }

    // JNE helper
    InsertBranch(Js::OpCode::BrNeq_A, helper, instr);

    // MOV dst, [&(inlineCache->result)]
    {
        IR::Opnd * cacheResult = IR::MemRefOpnd::New(inlineCache + Js::IsInstInlineCache::OffsetOfResult(), TyMachReg, m_func, IR::AddrOpndKindDynamicIsInstInlineCacheResultRef);
        InsertMove(instr->GetDst(), cacheResult, instr);
    }

    // JMP done
    InsertBranch(Js::OpCode::Br, done, instr);

    // LABEL helper
    instr->InsertBefore(helper);

    instr->InsertAfter(done);

    return true;
}